

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O3

void __thiscall
xLearn::SquaredLoss::Evaluate
          (SquaredLoss *this,vector<float,_std::allocator<float>_> *pred,
          vector<float,_std::allocator<float>_> *label)

{
  index_t *piVar1;
  pointer pfVar2;
  pointer pfVar3;
  ThreadPool *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  real_t rVar13;
  vector<float,_std::allocator<float>_> sum;
  Logger local_94;
  undefined1 local_90 [32];
  string local_70;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar3 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pfVar2 == pfVar3) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_94.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,"");
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Evaluate","");
    poVar7 = Logger::Start(ERR,&local_70,0x37,(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"pred.empty()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  else {
    if ((label->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start !=
        (label->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + (int)((ulong)((long)pfVar3 - (long)pfVar2) >> 2);
      local_70._M_dataplus._M_p = local_70._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_90,(this->super_Loss).threadNumber_,
                 (value_type_conflict1 *)&local_70,(allocator_type *)&local_94);
      uVar10 = (this->super_Loss).threadNumber_;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        lVar9 = 0;
        uVar11 = 0;
        do {
          uVar5 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          uVar6 = uVar5 / uVar10;
          local_70.field_2._M_allocated_capacity = uVar6 * uVar11;
          uVar12 = uVar11 + 1;
          uVar6 = uVar6 * uVar12;
          local_70._M_string_length = uVar5 % uVar10 + uVar6;
          if (uVar11 != uVar10 - 1) {
            local_70._M_string_length = uVar6;
          }
          local_70.field_2._8_8_ = local_90._0_8_ + lVar9;
          local_70._M_dataplus._M_p = (pointer)sq_evaluate_thread;
          local_50 = label;
          local_48 = pred;
          ThreadPool::
          enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
                    ((ThreadPool *)&stack0xffffffffffffffc0,
                     (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
                      *)(this->super_Loss).pool_);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          uVar10 = (this->super_Loss).threadNumber_;
          lVar9 = lVar9 + 4;
          uVar11 = uVar12;
        } while (uVar12 < uVar10);
      }
      pTVar4 = (this->super_Loss).pool_;
      local_70._M_dataplus._M_p = (pointer)&pTVar4->sync_mutex;
      local_70._M_string_length = local_70._M_string_length & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_70);
      local_70._M_string_length = CONCAT71(local_70._M_string_length._1_7_,1);
      if ((pTVar4->sync).super___atomic_base<int>._M_i != (int)uVar10) {
        do {
          std::condition_variable::wait((unique_lock *)&pTVar4->sync_condition);
        } while ((pTVar4->sync).super___atomic_base<int>._M_i != (int)uVar10);
      }
      LOCK();
      (pTVar4->sync).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_70);
      if (local_90._8_8_ - local_90._0_8_ == 0) {
        if ((pointer)local_90._0_8_ == (pointer)0x0) {
          return;
        }
      }
      else {
        rVar13 = (this->super_Loss).loss_sum_;
        lVar9 = (long)(local_90._8_8_ - local_90._0_8_) >> 2;
        lVar8 = 0;
        do {
          rVar13 = rVar13 + *(float *)(local_90._0_8_ + lVar8 * 4);
          lVar8 = lVar8 + 1;
          (this->super_Loss).loss_sum_ = rVar13;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar8);
      }
      operator_delete((void *)local_90._0_8_);
      return;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_94.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,"");
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Evaluate","");
    poVar7 = Logger::Start(ERR,&local_70,0x38,(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"label.empty()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_94);
  abort();
}

Assistant:

void SquaredLoss::Evaluate(const std::vector<real_t>& pred,
                          const std::vector<real_t>& label) {
  CHECK_NE(pred.empty(), true);
  CHECK_NE(label.empty(), true);
  total_example_ += pred.size();
  // multi-thread training
  std::vector<real_t> sum(threadNumber_, 0);
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(pred.size(), threadNumber_, i);
    size_t end_idx = getEnd(pred.size(), threadNumber_, i);
    pool_->enqueue(std::bind(sq_evaluate_thread,
                             &pred,
                             &label,
                             &(sum[i]),
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
  // Accumulate loss
  for (size_t i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}